

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

zt_unit_test * zt_unit_register_test(zt_unit_suite *suite,char *name,zt_unit_test_fn test_fn)

{
  zt_unit_test *head;
  zt_elist_t *nlist;
  char *pcVar1;
  zt_unit_test_fn in_RDX;
  char *in_RSI;
  size_t len;
  zt_unit_test *test;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  head = (zt_unit_test *)zt_calloc_p(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  nlist = (zt_elist_t *)strlen(in_RSI);
  pcVar1 = (char *)zt_calloc_p((size_t)head,(size_t)nlist);
  head->name = pcVar1;
  strncpy(head->name,in_RSI,(size_t)nlist);
  head->success = -1;
  head->test_fn = in_RDX;
  head->assertions = 0;
  zt_elist_add_tail(&head->test,nlist);
  return head;
}

Assistant:

struct zt_unit_test *
zt_unit_register_test(struct zt_unit_suite    * suite,
                      const char * name,
                      zt_unit_test_fn test_fn)
{
    struct zt_unit_test * test = zt_calloc(struct zt_unit_test, 1);
    size_t                len;

    zt_assert(suite);
    zt_assert(name);

    len = strlen(name);

    test->name = zt_calloc(char, len + 1);
    strncpy(test->name, name, len);
    test->success = -1;
    test->test_fn = test_fn;
    test->assertions = 0;

    zt_elist_add_tail(&suite->tests, &test->test);
    return test;
}